

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_access.h
# Opt level: O0

int __thiscall
Gudhi::persistence_matrix::
Row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false>_>_>
::unlink(Row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false>_>_>
         *this,char *__name)

{
  uint uVar1;
  Matrix_entry *entry_local;
  Row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false>_>_>
  *this_local;
  
  if (this->rows_ != (Row_container *)0x0) {
    uVar1 = boost::intrusive::
            generic_hook<(boost::intrusive::algo_types)0,_boost::intrusive::list_node_traits<void_*>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false>_>::Matrix_row_tag,_(boost::intrusive::link_mode_type)2,_(boost::intrusive::base_hook_type)1>
            ::unlink((generic_hook<(boost::intrusive::algo_types)0,_boost::intrusive::list_node_traits<void_*>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false>_>::Matrix_row_tag,_(boost::intrusive::link_mode_type)2,_(boost::intrusive::base_hook_type)1>
                      *)(__name + 8),__name);
    this = (Row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false>_>_>
            *)(ulong)uVar1;
  }
  return (int)this;
}

Assistant:

inline void Row_access<Master_matrix>::unlink(Matrix_entry* entry) 
{
  if (rows_ == nullptr) return;

  if constexpr (Master_matrix::Option_list::has_intrusive_rows) {
    entry->Base_hook_matrix_row::unlink();
  } else {
    if constexpr (Master_matrix::Option_list::has_removable_rows) {
      auto it = rows_->find(entry->get_row_index());
      it->second.erase(*entry);
    } else {
      rows_->operator[](entry->get_row_index()).erase(*entry);
    }
  }
}